

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

long __thiscall
libdivide::divider<long,_(libdivide::Branching)0>::recover
          (divider<long,_(libdivide::Branching)0> *this)

{
  byte bVar1;
  uint64_t result_1;
  uint64_t local_80;
  divider<long,_(libdivide::Branching)0> *this_local;
  int64_t result;
  uint64_t q;
  uint64_t rem_ignored;
  uint64_t n_lo;
  uint64_t n_hi;
  uint64_t d;
  int magic_was_negated;
  int negative_divisor;
  uint64_t absD;
  uint8_t shift;
  uint8_t more;
  
  bVar1 = (this->div).denom.more;
  if ((this->div).denom.magic == 0) {
    rem_ignored = 1L << (bVar1 & 0x3f);
    if ((bVar1 & 0x80) != 0) {
      rem_ignored = -rem_ignored;
    }
    d = rem_ignored;
  }
  else {
    local_80 = 1;
    if ((bVar1 & 0x80) != 0) {
      local_80 = 0xffffffffffffffff;
    }
    d = local_80;
  }
  return d;
}

Assistant:

T recover() const { return div.recover(); }